

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

RefPtr<wabt::interp::Extern> * __thiscall
wabt::interp::RefPtr<wabt::interp::Extern>::operator=
          (RefPtr<wabt::interp::Extern> *this,RefPtr<wabt::interp::Global> *other)

{
  Store *this_00;
  Index IVar1;
  
  this->obj_ = &other->obj_->super_Extern;
  this_00 = other->store_;
  this->store_ = this_00;
  if (this_00 == (Store *)0x0) {
    IVar1 = 0;
  }
  else {
    IVar1 = Store::CopyRoot(this_00,other->root_index_);
  }
  this->root_index_ = IVar1;
  return this;
}

Assistant:

RefPtr<T>& RefPtr<T>::operator=(const RefPtr<U>& other){
  obj_ = other.obj_;
  store_ = other.store_;
  root_index_ = store_ ? store_->CopyRoot(other.root_index_) : 0;
  return *this;
}